

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O1

void QtDebugUtils::formatQRect<QRect>(QDebug *debug,QRect *rect)

{
  Stream *this;
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(&debug->stream->ts,(rect->x1).m_i);
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QTextStream::operator<<(&debug->stream->ts,',');
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QTextStream::operator<<(&debug->stream->ts,(rect->y1).m_i);
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QTextStream::operator<<(&debug->stream->ts,' ');
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  lVar2 = (long)(rect->x2).m_i - (long)(rect->x1).m_i;
  lVar1 = (long)(rect->y2).m_i - (long)(rect->y1).m_i;
  QTextStream::operator<<(&debug->stream->ts,lVar2 + 1);
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QTextStream::operator<<(&debug->stream->ts,'x');
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QTextStream::operator<<(&debug->stream->ts,lVar1 + 1);
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  if (0x7ffffffe < lVar1 || 0x7ffffffe < lVar2) {
    this = debug->stream;
    QVar3.m_data = (storage_type *)0xc;
    QVar3.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(&this->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (debug->stream->space == true) {
      QTextStream::operator<<(&debug->stream->ts,' ');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatQRect(QDebug &debug, const Rect &rect)
{
    debug << rect.x() << ',' << rect.y() << ' ';
    if constexpr (std::is_same_v<Rect, QRect>) {
        // QRect may overflow. Calculate width and height in higher precision.
        const qint64 w = qint64(rect.right()) - rect.left() + 1;
        const qint64 h = qint64(rect.bottom()) - rect.top() + 1;
        debug << w << 'x' << h;

        constexpr qint64 M = (std::numeric_limits<int>::max)();
        if (w > M || h > M)
            debug << " (oversized)";
    } else {
        debug << rect.width() << 'x' << rect.height();
    }
}